

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int bsc_xfer(int pi,bsc_xfer_t *bscxfer)

{
  int iVar1;
  int status;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)bscxfer->txCnt;
  ext[0].ptr = bscxfer->txBuf;
  iVar1 = pigpio_command_ext(pi,0x72,bscxfer->control,0,bscxfer->txCnt,1,ext,0);
  if (0 < iVar1) {
    recvMax(pi,&status,4,4);
    status = (uint)status >> 0x18 | (status & 0xff0000U) >> 8 | (status & 0xff00U) << 8 |
             status << 0x18;
    iVar1 = recvMax(pi,bscxfer->rxBuf,0x200,iVar1 + -4);
    bscxfer->rxCnt = iVar1;
    iVar1 = status;
  }
  status = iVar1;
  _pmu(pi);
  return status;
}

Assistant:

int bsc_xfer(int pi, bsc_xfer_t *bscxfer)
{
   int bytes;
   int status;
   gpioExtent_t ext[1];

   /*
   p1=control
   p2=0
   p3=len
   ## extension ##
   char buf[len]
   */

   ext[0].size = bscxfer->txCnt;
   ext[0].ptr = bscxfer->txBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_BSCX, bscxfer->control, 0, bscxfer->txCnt, 1, ext, 0);

   if (bytes > 0)
   {
      recvMax(pi, &status, 4, 4);
      status = ntohl(status);
      bytes -= 4;
      bytes = recvMax(pi, bscxfer->rxBuf, sizeof(bscxfer->rxBuf), bytes);
      bscxfer->rxCnt = bytes;
   }
   else
   {
      status = bytes;
   }

   _pmu(pi);

   return status;
}